

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtab.c
# Opt level: O2

void StrTab_GetPosName(strtab *p,size_t Pos,tchar_t *Out,size_t OutLen)

{
  fourcc_t *pfVar1;
  
  *Out = '\0';
  if (Pos < (p->Table)._Used >> 3) {
    pfVar1 = *(fourcc_t **)((p->Table)._Begin + Pos * 8);
    FourCCToString(Out,OutLen,*pfVar1);
    stprintf_s(Out + 4,OutLen - 4,"%04X",(ulong)pfVar1[1]);
    return;
  }
  return;
}

Assistant:

void StrTab_GetPosName(strtab *p, size_t Pos, tchar_t *Out, size_t OutLen)
{
    *Out = 0;
    if (Pos < ARRAYCOUNT(p->Table,stringdef*))
    {
        stringdef *i = ARRAYBEGIN(p->Table,stringdef*)[Pos];
        FourCCToString(Out,OutLen,i->Class);
        stprintf_s(Out+4,OutLen-4,T("%04X"),i->Id);
    }
}